

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUpsize.c
# Opt level: O1

void Abc_SclUndoRecentChanges(Abc_Ntk_t *pNtk,Vec_Int_t *vTrans)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  void **ppvVar6;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pFaninNew;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  
  uVar1 = vTrans->nSize;
  if (0x55555554 < uVar1 * -0x55555555 + 0x2aaaaaaa) {
    __assert_fail("Vec_IntSize(vTrans) % 3 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclUpsize.c"
                  ,0x2d3,"void Abc_SclUndoRecentChanges(Abc_Ntk_t *, Vec_Int_t *)");
  }
  if (2 < (int)uVar1) {
    lVar9 = ((ulong)uVar1 / 3) * 3 + -1;
    lVar10 = (ulong)uVar1 / 3 + 1;
    do {
      lVar8 = (long)vTrans->nSize;
      if (lVar8 <= lVar9 + -2) goto LAB_00475d2f;
      piVar5 = vTrans->pArray;
      iVar7 = piVar5[lVar9 + -2];
      if ((long)iVar7 < 0) {
LAB_00475d10:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar2 = pNtk->vObjs->nSize;
      if (iVar2 <= iVar7) goto LAB_00475d10;
      if (lVar8 <= lVar9 + -1) {
LAB_00475d2f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar3 = piVar5[lVar9 + -1];
      if (((long)iVar3 < 0) || (iVar2 <= iVar3)) goto LAB_00475d10;
      if (lVar8 <= lVar9) goto LAB_00475d2f;
      iVar4 = piVar5[lVar9];
      if (((long)iVar4 < 0) || (iVar2 <= iVar4)) goto LAB_00475d10;
      ppvVar6 = pNtk->vObjs->pArray;
      pObj = (Abc_Obj_t *)ppvVar6[iVar7];
      pFaninNew = (Abc_Obj_t *)ppvVar6[iVar4];
      Abc_ObjPatchFanin(pObj,(Abc_Obj_t *)ppvVar6[iVar3],pFaninNew);
      Abc_SclTimeIncUpdateLevel(pObj);
      if (pNtk->vPhases != (Vec_Int_t *)0x0) {
        iVar7 = Abc_SclIsInv(pFaninNew);
        if (iVar7 != 0) {
          Abc_NodeInvUpdateObjFanoutPolarity(pFaninNew,pObj);
        }
      }
      lVar10 = lVar10 + -1;
      lVar9 = lVar9 + -3;
    } while (1 < lVar10);
  }
  return;
}

Assistant:

void Abc_SclUndoRecentChanges( Abc_Ntk_t * pNtk, Vec_Int_t * vTrans )
{
    int i;
    assert( Vec_IntSize(vTrans) % 3 == 0 );
    for ( i = Vec_IntSize(vTrans)/3 - 1; i >= 0; i-- )
    {
        Abc_Obj_t * pFanout = Abc_NtkObj( pNtk, Vec_IntEntry(vTrans, 3*i+0) );
        Abc_Obj_t * pFanin  = Abc_NtkObj( pNtk, Vec_IntEntry(vTrans, 3*i+1) );
        Abc_Obj_t * pObj    = Abc_NtkObj( pNtk, Vec_IntEntry(vTrans, 3*i+2) );
        // we do not update load here because times will be recomputed
        Abc_ObjPatchFanin( pFanout, pFanin, pObj );
        Abc_SclTimeIncUpdateLevel( pFanout );
//        printf( "Node %6d  Redir fanout %6d from fanin %6d. \n", 
//            Abc_ObjId(pObj), Abc_ObjId(pFanout), Abc_ObjId(pFanin) );
        // update polarity
        if ( pNtk->vPhases && Abc_SclIsInv(pObj) )
            Abc_NodeInvUpdateObjFanoutPolarity( pObj, pFanout );
    }
}